

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

double MATROSKA_TrackTimestampScale(ebml_master *Track)

{
  ebml_context *peVar1;
  bool_t bVar2;
  ebml_element *peVar3;
  ebml_element *TimestampScale;
  ebml_master *Track_local;
  
  peVar1 = MATROSKA_getContextTrackEntry();
  bVar2 = EBML_ElementIsType(&Track->Base,peVar1);
  if (bVar2 != 0) {
    peVar1 = MATROSKA_getContextTrackTimestampScale();
    peVar3 = EBML_MasterFindFirstElt(Track,peVar1,0,0,0);
    if (peVar3 == (ebml_element *)0x0) {
      peVar1 = MATROSKA_getContextTrackTimestampScale();
      Track_local = (ebml_master *)(double)peVar1->DefaultValue;
    }
    else {
      Track_local = *(ebml_master **)&peVar3[1].Base.Base;
    }
    return (double)Track_local;
  }
  __assert_fail("EBML_ElementIsType((ebml_element*)Track, MATROSKA_getContextTrackEntry())",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                ,0x314,"double MATROSKA_TrackTimestampScale(const ebml_master *)");
}

Assistant:

double MATROSKA_TrackTimestampScale(const ebml_master *Track)
{
    ebml_element *TimestampScale;
    assert(EBML_ElementIsType((ebml_element*)Track, MATROSKA_getContextTrackEntry()));
    TimestampScale = EBML_MasterFindChild((ebml_master*)Track,MATROSKA_getContextTrackTimestampScale());
    if (!TimestampScale)
        return MATROSKA_getContextTrackTimestampScale()->DefaultValue;
    return ((ebml_float*)TimestampScale)->Value;
}